

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_writer_add_to_central_dir
                  (mz_zip_archive *pZip,char *pFilename,mz_uint16 filename_size,void *pExtra,
                  mz_uint16 extra_size,void *pComment,mz_uint16 comment_size,mz_uint64 uncomp_size,
                  mz_uint64 comp_size,mz_uint32 uncomp_crc32,mz_uint16 method,mz_uint16 bit_flags,
                  mz_uint16 dos_time,mz_uint16 dos_date,mz_uint64 local_header_ofs,
                  mz_uint32 ext_attributes,char *user_extra_data,mz_uint user_extra_data_len)

{
  ulong uVar1;
  bool bVar2;
  mz_bool mVar3;
  ulong uVar4;
  ulong uVar5;
  void *in_RCX;
  ushort in_DX;
  uint uVar6;
  void *in_RSI;
  long in_RDI;
  ushort in_R8W;
  void *in_R9;
  uint uVar7;
  ushort in_stack_00000008;
  ushort in_stack_00000038;
  mz_uint8 central_dir_header [46];
  size_t orig_central_dir_size;
  mz_uint32 central_dir_ofs;
  mz_zip_internal_state *pState;
  size_t orig_size_5;
  size_t orig_size_4;
  size_t orig_size_3;
  size_t orig_size_2;
  size_t orig_size_1;
  size_t orig_size;
  mz_uint in_stack_fffffffffffffcf4;
  undefined4 in_stack_fffffffffffffcfc;
  undefined4 in_stack_fffffffffffffd04;
  mz_uint16 in_stack_fffffffffffffd14;
  mz_uint16 in_stack_fffffffffffffd16;
  mz_uint8 *in_stack_fffffffffffffd18;
  mz_zip_archive *in_stack_fffffffffffffd20;
  undefined4 local_2ac;
  long *local_2a8;
  void *local_2a0;
  ushort local_292;
  void *local_290;
  ushort local_282;
  void *local_280;
  long local_278;
  undefined4 local_22c;
  ulong local_228;
  long *local_220;
  long local_218;
  long local_208;
  long local_200;
  undefined4 *local_1f8;
  mz_uint64 in_stack_fffffffffffffe10;
  long *plVar8;
  mz_uint32 in_stack_fffffffffffffe18;
  mz_uint16 in_stack_fffffffffffffe20;
  mz_uint16 in_stack_fffffffffffffe28;
  mz_uint16 in_stack_fffffffffffffe30;
  long *plVar9;
  mz_uint16 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  mz_uint32 in_stack_fffffffffffffe48;
  long lVar10;
  
  local_2a8 = *(long **)(in_RDI + 0x68);
  local_2ac = (undefined4)local_2a8[1];
  uVar1 = local_2a8[1];
  if ((*(int *)(*(long *)(in_RDI + 0x68) + 100) == 0) &&
     (0xffffffff < (ulong)central_dir_header._8_8_)) {
    if (in_RDI != 0) {
      *(undefined4 *)(in_RDI + 0x1c) = 3;
    }
  }
  else if (local_2a8[1] + 0x2e + (ulong)in_DX + (ulong)in_R8W +
           (ulong)(uint)central_dir_header._32_4_ + (ulong)in_stack_00000008 < 0xffffffff) {
    uVar6 = (uint)in_stack_00000038;
    uVar7 = (uint)(ushort)central_dir_header._0_2_;
    local_2a0 = in_R9;
    local_292 = in_R8W;
    local_290 = in_RCX;
    local_282 = in_DX;
    local_280 = in_RSI;
    local_278 = in_RDI;
    mVar3 = mz_zip_writer_create_central_dir_header
                      (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd16
                       ,in_stack_fffffffffffffd14,SUB42(central_dir_header._16_4_,2),
                       central_dir_header._8_8_,in_stack_fffffffffffffe10,in_stack_fffffffffffffe18,
                       in_stack_fffffffffffffe20,in_stack_fffffffffffffe28,in_stack_fffffffffffffe30
                       ,in_stack_fffffffffffffe38,
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       in_stack_fffffffffffffe48);
    plVar9 = local_2a8;
    if (mVar3 == 0) {
      if (local_278 != 0) {
        *(undefined4 *)(local_278 + 0x1c) = 0x1b;
      }
    }
    else {
      lVar10 = local_2a8[1];
      uVar4 = lVar10 + 0x2e;
      if (((ulong)local_2a8[2] < uVar4) &&
         (mVar3 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)central_dir_header._8_8_,
                             (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                             CONCAT44(in_stack_fffffffffffffcfc,uVar6),in_stack_fffffffffffffcf4),
         mVar3 == 0)) {
        bVar2 = false;
      }
      else {
        plVar9[1] = uVar4;
        bVar2 = true;
      }
      if (bVar2) {
        memcpy((void *)(*plVar9 + lVar10 * (ulong)*(uint *)(plVar9 + 3)),&stack0xfffffffffffffd18,
               (ulong)*(uint *)(plVar9 + 3) * 0x2e);
        plVar9 = local_2a8;
        uVar4 = (ulong)local_282;
        lVar10 = local_2a8[1];
        uVar5 = lVar10 + uVar4;
        if (((ulong)local_2a8[2] < uVar5) &&
           (mVar3 = mz_zip_array_ensure_capacity
                              ((mz_zip_archive *)central_dir_header._8_8_,
                               (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                               CONCAT44(in_stack_fffffffffffffcfc,uVar6),in_stack_fffffffffffffcf4),
           mVar3 == 0)) {
          bVar2 = false;
        }
        else {
          plVar9[1] = uVar5;
          bVar2 = true;
        }
        if (bVar2) {
          if (uVar4 != 0) {
            memcpy((void *)(*plVar9 + lVar10 * (ulong)*(uint *)(plVar9 + 3)),local_280,
                   uVar4 * *(uint *)(plVar9 + 3));
          }
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        plVar9 = local_2a8;
        if (bVar2) {
          uVar4 = (ulong)local_292;
          lVar10 = local_2a8[1];
          uVar5 = lVar10 + uVar4;
          if (((ulong)local_2a8[2] < uVar5) &&
             (mVar3 = mz_zip_array_ensure_capacity
                                ((mz_zip_archive *)central_dir_header._8_8_,
                                 (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                                 CONCAT44(in_stack_fffffffffffffcfc,uVar6),in_stack_fffffffffffffcf4
                                ), mVar3 == 0)) {
            bVar2 = false;
          }
          else {
            plVar9[1] = uVar5;
            bVar2 = true;
          }
          if (bVar2) {
            if (uVar4 != 0) {
              memcpy((void *)(*plVar9 + lVar10 * (ulong)*(uint *)(plVar9 + 3)),local_290,
                     uVar4 * *(uint *)(plVar9 + 3));
            }
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          plVar9 = local_2a8;
          if (bVar2) {
            uVar4 = (ulong)(uint)central_dir_header._32_4_;
            lVar10 = local_2a8[1];
            uVar5 = lVar10 + uVar4;
            if (((ulong)local_2a8[2] < uVar5) &&
               (mVar3 = mz_zip_array_ensure_capacity
                                  ((mz_zip_archive *)central_dir_header._8_8_,
                                   (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                                   CONCAT44(in_stack_fffffffffffffcfc,uVar6),
                                   in_stack_fffffffffffffcf4), mVar3 == 0)) {
              bVar2 = false;
            }
            else {
              plVar9[1] = uVar5;
              bVar2 = true;
            }
            if (bVar2) {
              if (uVar4 != 0) {
                memcpy((void *)(*plVar9 + lVar10 * (ulong)*(uint *)(plVar9 + 3)),
                       (void *)central_dir_header._24_8_,uVar4 * *(uint *)(plVar9 + 3));
              }
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
            plVar9 = local_2a8;
            if (bVar2) {
              uVar4 = (ulong)in_stack_00000008;
              lVar10 = local_2a8[1];
              uVar5 = lVar10 + uVar4;
              if (((ulong)local_2a8[2] < uVar5) &&
                 (mVar3 = mz_zip_array_ensure_capacity
                                    ((mz_zip_archive *)central_dir_header._8_8_,
                                     (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                                     CONCAT44(in_stack_fffffffffffffcfc,uVar6),
                                     in_stack_fffffffffffffcf4), mVar3 == 0)) {
                bVar2 = false;
              }
              else {
                plVar9[1] = uVar5;
                bVar2 = true;
              }
              if (bVar2) {
                if (uVar4 != 0) {
                  memcpy((void *)(*plVar9 + lVar10 * (ulong)*(uint *)(plVar9 + 3)),local_2a0,
                         uVar4 * *(uint *)(plVar9 + 3));
                }
                bVar2 = true;
              }
              else {
                bVar2 = false;
              }
              if (bVar2) {
                plVar8 = local_2a8 + 4;
                local_1f8 = &local_2ac;
                local_200 = 1;
                local_208 = local_2a8[5];
                uVar4 = local_208 + 1;
                plVar9 = plVar8;
                if (((ulong)local_2a8[6] < uVar4) &&
                   (mVar3 = mz_zip_array_ensure_capacity
                                      ((mz_zip_archive *)central_dir_header._8_8_,
                                       (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                                       CONCAT44(in_stack_fffffffffffffcfc,uVar6),
                                       in_stack_fffffffffffffcf4), mVar3 == 0)) {
                  bVar2 = false;
                }
                else {
                  plVar9[1] = uVar4;
                  bVar2 = true;
                }
                if (bVar2) {
                  if (local_200 != 0) {
                    memcpy((void *)(*plVar8 + local_208 * (ulong)*(uint *)(plVar8 + 3)),local_1f8,
                           local_200 * (ulong)*(uint *)(plVar8 + 3));
                  }
                  bVar2 = true;
                }
                else {
                  bVar2 = false;
                }
                if (bVar2) {
                  return 1;
                }
              }
            }
          }
        }
      }
      local_218 = local_278;
      local_220 = local_2a8;
      local_22c = 0;
      local_228 = uVar1;
      if ((uVar1 <= (ulong)local_2a8[2]) ||
         (mVar3 = mz_zip_array_ensure_capacity
                            ((mz_zip_archive *)central_dir_header._8_8_,
                             (mz_zip_array *)CONCAT44(in_stack_fffffffffffffd04,uVar7),
                             CONCAT44(in_stack_fffffffffffffcfc,uVar6),in_stack_fffffffffffffcf4),
         mVar3 != 0)) {
        local_220[1] = local_228;
      }
      if (local_278 != 0) {
        *(undefined4 *)(local_278 + 0x1c) = 0x10;
      }
    }
  }
  else if (in_RDI != 0) {
    *(undefined4 *)(in_RDI + 0x1c) = 0xf;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_writer_add_to_central_dir(
    mz_zip_archive *pZip, const char *pFilename, mz_uint16 filename_size,
    const void *pExtra, mz_uint16 extra_size, const void *pComment,
    mz_uint16 comment_size, mz_uint64 uncomp_size, mz_uint64 comp_size,
    mz_uint32 uncomp_crc32, mz_uint16 method, mz_uint16 bit_flags,
    mz_uint16 dos_time, mz_uint16 dos_date, mz_uint64 local_header_ofs,
    mz_uint32 ext_attributes, const char *user_extra_data,
    mz_uint user_extra_data_len) {
  mz_zip_internal_state *pState = pZip->m_pState;
  mz_uint32 central_dir_ofs = (mz_uint32)pState->m_central_dir.m_size;
  size_t orig_central_dir_size = pState->m_central_dir.m_size;
  mz_uint8 central_dir_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];

  if (!pZip->m_pState->m_zip64) {
    if (local_header_ofs > 0xFFFFFFFF)
      return mz_zip_set_error(pZip, MZ_ZIP_FILE_TOO_LARGE);
  }

  /* miniz doesn't support central dirs >= MZ_UINT32_MAX bytes yet */
  if (((mz_uint64)pState->m_central_dir.m_size +
       MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + filename_size + extra_size +
       user_extra_data_len + comment_size) >= MZ_UINT32_MAX)
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

  if (!mz_zip_writer_create_central_dir_header(
          pZip, central_dir_header, filename_size,
          (mz_uint16)(extra_size + user_extra_data_len), comment_size,
          uncomp_size, comp_size, uncomp_crc32, method, bit_flags, dos_time,
          dos_date, local_header_ofs, ext_attributes))
    return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

  if ((!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_dir_header,
                               MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pFilename,
                               filename_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pExtra,
                               extra_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, user_extra_data,
                               user_extra_data_len)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pComment,
                               comment_size)) ||
      (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets,
                               &central_dir_ofs, 1))) {
    /* Try to resize the central directory array back into its original state.
     */
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
  }

  return MZ_TRUE;
}